

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Builder::sortObjectIndexLong
          (Builder *this,uint8_t *objBase,iterator indexStart,iterator indexEnd)

{
  bool bVar1;
  pointer this_00;
  iterator iVar2;
  iterator iVar3;
  type this_01;
  reference pvVar4;
  reference puVar5;
  size_t i_1;
  SortEntry e;
  size_t i;
  size_t n;
  unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
  *tmp;
  vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
  *in_stack_ffffffffffffff68;
  uint64_t uVar6;
  unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
  *in_stack_ffffffffffffff70;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff78;
  ulong __n;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff80;
  uint8_t *in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff98;
  vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
  *in_stack_ffffffffffffffa0;
  ulong local_50;
  ulong local_38 [2];
  undefined8 local_28;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_8;
  
  local_28 = _ZTWN12_GLOBAL__N_111sortEntriesE();
  _ZTWN12_GLOBAL__N_111sortEntriesE();
  bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    std::
    make_unique<std::vector<(anonymous_namespace)::SortEntry,std::allocator<(anonymous_namespace)::SortEntry>>>
              ();
    _ZTWN12_GLOBAL__N_111sortEntriesE();
    std::
    unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
    ::operator=(in_stack_ffffffffffffff70,
                (unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
                 *)in_stack_ffffffffffffff68);
    std::
    unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
    ::~unique_ptr(in_stack_ffffffffffffff70);
  }
  else {
    _ZTWN12_GLOBAL__N_111sortEntriesE();
    std::
    unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
    ::operator->((unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
                  *)0x11247a);
    std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
    ::clear((vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
             *)0x112482);
  }
  local_38[0] = std::
                distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                          (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = std::
            unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
            ::operator->((unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
                          *)0x1124ba);
  std::max<unsigned_long>(&::(anonymous_namespace)::minSortEntriesAllocation,local_38);
  std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>::
  reserve(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  for (local_50 = 0; local_50 < local_38[0]; local_50 = local_50 + 1) {
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator[](&local_8,local_50);
    anon_unknown.dwarf_2231d::findAttrName
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80._M_current);
    std::
    unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
    ::operator->((unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
                  *)0x112533);
    std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
    ::push_back((vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                 *)in_stack_ffffffffffffff80._M_current,
                (value_type *)in_stack_ffffffffffffff78._M_current);
  }
  std::
  unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
  ::operator->((unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
                *)0x11255a);
  iVar2 = std::
          vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
          ::begin(in_stack_ffffffffffffff68);
  std::
  unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
  ::operator->((unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
                *)0x112571);
  iVar3 = std::
          vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
          ::end(in_stack_ffffffffffffff68);
  std::
  sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::SortEntry*,std::vector<(anonymous_namespace)::SortEntry,std::allocator<(anonymous_namespace)::SortEntry>>>,arangodb::velocypack::Builder::sortObjectIndexLong(unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>)const::__0>
            (iVar2._M_current,iVar3._M_current);
  for (__n = 0; __n < local_38[0]; __n = __n + 1) {
    this_01 = std::
              unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
              ::operator*((unique_ptr<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>,_std::default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>_>
                           *)this_00);
    pvVar4 = std::
             vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
             ::operator[](this_01,__n);
    uVar6 = pvVar4->offset;
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator[](&local_8,__n);
    *puVar5 = uVar6;
  }
  return;
}

Assistant:

void Builder::sortObjectIndexLong(
    uint8_t* objBase, std::vector<ValueLength>::iterator indexStart,
    std::vector<ValueLength>::iterator indexEnd) const {
#ifndef VELOCYPACK_NO_THREADLOCALS
  std::unique_ptr<std::vector<SortEntry>>& tmp = ::sortEntries;

  // start with clean sheet in case the previous run left something
  // in the vector (e.g. when bailing out with an exception)
  if (::sortEntries == nullptr) {
    ::sortEntries = std::make_unique<std::vector<SortEntry>>();
  } else {
    ::sortEntries->clear();
  }
#else
  auto tmp = std::make_unique<std::vector<SortEntry>>();
#endif

  std::size_t const n = std::distance(indexStart, indexEnd);
  VELOCYPACK_ASSERT(n > 1);
  tmp->reserve(std::max(::minSortEntriesAllocation, n));
  for (std::size_t i = 0; i < n; i++) {
    SortEntry e;
    e.offset = indexStart[i];
    e.nameStart = ::findAttrName(objBase + e.offset, e.nameSize);
    tmp->push_back(e);
  }
  VELOCYPACK_ASSERT(tmp->size() == n);
  std::sort(tmp->begin(), tmp->end(),
            [](SortEntry const& a, SortEntry const& b)
#ifdef VELOCYPACK_64BIT
                noexcept
#endif
            {
              // return true iff a < b:
              uint64_t sizea = a.nameSize;
              uint64_t sizeb = b.nameSize;
              std::size_t const compareLength =
                  checkOverflow((std::min)(sizea, sizeb));
              int res = std::memcmp(a.nameStart, b.nameStart, compareLength);

              return (res < 0 || (res == 0 && sizea < sizeb));
            });

  // copy back the sorted offsets
  for (std::size_t i = 0; i < n; i++) {
    indexStart[i] = (*tmp)[i].offset;
  }
}